

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O0

tlc_string_t * __thiscall
TURBOLINECOUNT::CLineCount::lastErrorString_abi_cxx11_
          (tlc_string_t *__return_storage_ptr__,CLineCount *this)

{
  CLineCount *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_lasterrorstring);
  return __return_storage_ptr__;
}

Assistant:

tlc_string_t CLineCount::lastErrorString() const
{
	return m_lasterrorstring;
}